

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

kp_error_t list_dir(kp_ctx *ctx,char *root,char *indent,_Bool print_path)

{
  uint uVar1;
  char **__ptr;
  kp_error_t kVar2;
  kp_error_t extraout_EAX;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  int nsafes;
  char **local_38;
  
  nsafes = 0;
  local_38 = (char **)calloc(0,8);
  kVar2 = list_dir_r(&local_38,&nsafes,root);
  __ptr = local_38;
  uVar1 = nsafes;
  if (kVar2 == 0) {
    qsort(local_38,(long)nsafes,8,path_sort);
    if (print_path) {
      sVar3 = strlen(ctx->ws_path);
      __printf_chk(1,"%s/\n",root + sVar3 + 1);
    }
    sVar3 = strlen(root);
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    uVar4 = (ulong)uVar1;
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      __printf_chk(1,"%s%s\n",indent,__ptr[uVar5] + sVar3 + 1);
    }
  }
  else {
    uVar4 = (ulong)(uint)nsafes;
    if (nsafes < 1) {
      uVar4 = 0;
    }
  }
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    free(__ptr[uVar5]);
  }
  free(__ptr);
  return extraout_EAX;
}

Assistant:

static kp_error_t
list_dir(struct kp_ctx *ctx, char *root, char *indent, bool print_path)
{
	kp_error_t ret;
	char **safes = NULL;
	int nsafes = 0, i = 0;
	size_t ignore;

	safes = calloc(nsafes, sizeof(char *));

	if ((ret = list_dir_r(&safes, &nsafes, root)) != KP_SUCCESS) {
		goto out;
	}

	qsort(safes, nsafes, sizeof(char *), path_sort);

	if (print_path) {
		printf("%s/\n", root + strlen(ctx->ws_path) + 1);
	}
	ignore = strlen(root) + 1;
	for (i = 0; i < nsafes; i++) {
		printf("%s%s\n", indent, safes[i] + ignore);
	}

out:
	for (i = 0; i < nsafes; i++) {
		free(safes[i]);
	}
	free(safes);

	return ret;
}